

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getFrameVel
          (KinDynComputations *this,FrameIndex frameIdx,Span<double,__1L> twist)

{
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDX;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDI;
  bool ok;
  int expected_twist_size;
  FrameIndex in_stack_000000d0;
  KinDynComputations *in_stack_000000d8;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffff60;
  SpatialMotionVector *in_stack_ffffffffffffffc8;
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1cb5cb);
  if (iVar1 == 6) {
    getFrameVel(in_stack_000000d8,in_stack_000000d0);
    toEigen(in_stack_ffffffffffffffc8);
    toEigen((Span<double,__1L>)in_stack_ffffffffffffff60);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=(in_RDX,in_RDI);
  }
  else {
    iDynTree::reportError("KinDynComputations","getFrameVel","Wrong size in input twist");
  }
  return iVar1 == 6;
}

Assistant:

bool KinDynComputations::getFrameVel(const FrameIndex frameIdx, Span<double>twist)
{

    constexpr int expected_twist_size = 6;
    bool ok = twist.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","getFrameVel","Wrong size in input twist");
        return false;
    }


    toEigen(twist) = toEigen(getFrameVel(frameIdx));
    return true;
}